

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

RegOpnd * __thiscall
Lowerer::GenerateArrayTest
          (Lowerer *this,RegOpnd *baseOpnd,LabelInstr *isNotObjectLabel,LabelInstr *isNotArrayLabel,
          Instr *insertBeforeInstr,bool forceFloat,bool isStore,bool allowDefiniteArray)

{
  Func *func_00;
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  ObjectType OVar4;
  int iVar5;
  undefined4 *puVar6;
  IntConstOpnd *testSrc2;
  Opnd *pOVar7;
  LabelInstr *instr;
  ScriptContextInfo *pSVar8;
  undefined4 extraout_var;
  MemRefOpnd *src;
  Instr *instr_00;
  LabelInstr *pLVar9;
  BranchInstr *pBVar10;
  IndirOpnd *pIVar11;
  VTableValue local_148;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_d2;
  BranchInstr *pBStack_d0;
  ValueType arrayValueType;
  BranchInstr *branchInstr_2;
  BranchInstr *branchInstr_1;
  LabelInstr *goodArrayLabel_1;
  Instr *helperInstr;
  LabelInstr *notFloatArrayLabel;
  BranchInstr *branchInstr;
  LabelInstr *goodArrayLabel;
  Opnd *vtableVirtualOpnd;
  Opnd *vtableOpnd;
  VTableValue local_80;
  VTableValue virtualVtableAddress;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_74;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_72;
  VTableValue vtableAddress;
  undefined1 local_60 [8];
  AutoReuseOpnd autoReuseArrayOpnd;
  RegOpnd *arrayOpnd;
  Func *func;
  ValueType baseValueType;
  bool allowDefiniteArray_local;
  bool isStore_local;
  Instr *pIStack_30;
  bool forceFloat_local;
  Instr *insertBeforeInstr_local;
  LabelInstr *isNotArrayLabel_local;
  LabelInstr *isNotObjectLabel_local;
  RegOpnd *baseOpnd_local;
  Lowerer *this_local;
  
  func._6_1_ = isStore;
  func._5_1_ = allowDefiniteArray;
  func._7_1_ = forceFloat;
  pIStack_30 = insertBeforeInstr;
  if (baseOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3bdf,"(baseOpnd)","baseOpnd");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  func._2_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(&baseOpnd->super_Opnd);
  bVar3 = ValueType::IsAnyOptimizedArray((ValueType *)((long)&func + 2));
  if (((bVar3) && ((func._5_1_ & 1) == 0)) &&
     (bVar3 = ValueType::IsNativeArray((ValueType *)((long)&func + 2)), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3be4,
                       "(!baseValueType.IsAnyOptimizedArray() || allowDefiniteArray || baseValueType.IsNativeArray())"
                       ,
                       "!baseValueType.IsAnyOptimizedArray() || allowDefiniteArray || baseValueType.IsNativeArray()"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = ValueType::IsUninitialized((ValueType *)((long)&func + 2));
  if ((!bVar3) && (bVar3 = ValueType::HasBeenObject((ValueType *)((long)&func + 2)), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3be5,"(baseValueType.IsUninitialized() || baseValueType.HasBeenObject())",
                       "baseValueType.IsUninitialized() || baseValueType.HasBeenObject()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (isNotObjectLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3be7,"(isNotObjectLabel)","isNotObjectLabel");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (isNotArrayLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3be8,"(isNotArrayLabel)","isNotArrayLabel");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (pIStack_30 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3be9,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  func_00 = pIStack_30->m_func;
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_60);
  bVar3 = ValueType::IsLikelyObject((ValueType *)((long)&func + 2));
  if ((bVar3) &&
     (OVar4 = ValueType::GetObjectType((ValueType *)((long)&func + 2)), OVar4 == ObjectWithArray)) {
    GenerateObjectTypeTest(this,baseOpnd,pIStack_30,isNotObjectLabel);
    GenerateObjectHeaderInliningTest(this,baseOpnd,isNotArrayLabel,pIStack_30);
    autoReuseArrayOpnd._16_8_ = LoadObjectArray(this,baseOpnd,pIStack_30);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)local_60,(Opnd *)autoReuseArrayOpnd._16_8_,func_00,false);
    InsertTestBranch((Opnd *)autoReuseArrayOpnd._16_8_,(Opnd *)autoReuseArrayOpnd._16_8_,BrEq_A,
                     isNotArrayLabel,pIStack_30);
    uVar2 = autoReuseArrayOpnd._16_8_;
    testSrc2 = IR::IntConstOpnd::New(1,TyUint8,func_00,true);
    InsertTestBranch((Opnd *)uVar2,&testSrc2->super_Opnd,BrNeq_A,isNotArrayLabel,pIStack_30);
  }
  else {
    bVar3 = IR::Opnd::IsNotTaggedValue(&baseOpnd->super_Opnd);
    if (!bVar3) {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,&baseOpnd->super_Opnd,pIStack_30,isNotObjectLabel,false);
    }
    pOVar7 = IR::Opnd::Copy(&baseOpnd->super_Opnd,func_00);
    autoReuseArrayOpnd._16_8_ = IR::Opnd::AsRegOpnd(pOVar7);
    bVar3 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)((long)&func + 2));
    uVar2 = autoReuseArrayOpnd._16_8_;
    if (!bVar3) {
      local_74.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Array);
      local_72.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_74.field_0);
      vtableAddress._0_2_ = ValueType::SetHasNoMissingValues((ValueType *)&local_72.field_0,false);
      vtableAddress._2_2_ = ValueType::SetArrayTypeId((ValueType *)&vtableAddress,TypeIds_Array);
      IR::Opnd::SetValueType((Opnd *)uVar2,(ValueType)vtableAddress._2_2_);
    }
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)local_60,(Opnd *)autoReuseArrayOpnd._16_8_,func_00,false);
  }
  bVar3 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)((long)&func + 2));
  if (bVar3) {
    local_148 = GetArrayVtableAddress((ValueType)func._2_2_,false);
  }
  else {
    local_148 = VtableJavascriptArray;
  }
  local_80 = VtableInvalid;
  bVar3 = ValueType::IsLikelyMixedTypedArrayType((ValueType *)((long)&func + 2));
  if (bVar3) {
    local_80 = GetArrayVtableAddress((ValueType)func._2_2_,true);
  }
  if (((func._6_1_ & 1) == 0) ||
     ((local_148 != VtableJavascriptArray &&
      (bVar3 = ValueType::IsLikelyNativeArray((ValueType *)((long)&func + 2)), !bVar3)))) {
    vtableVirtualOpnd = LoadVTableValueOpnd(this,pIStack_30,local_148);
  }
  else {
    vtableVirtualOpnd = &IR::RegOpnd::New(TyUint64,func_00)->super_Opnd;
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)((long)&func + 2));
    if (bVar3) {
      bVar3 = ValueType::HasIntElements((ValueType *)((long)&func + 2));
      if (bVar3) {
        pOVar7 = LoadOptimizationOverridesValueOpnd
                           (this,pIStack_30,OptimizationOverridesIntArraySetElementFastPathVtable);
        InsertMove(vtableVirtualOpnd,pOVar7,pIStack_30,true);
      }
      else {
        bVar3 = ValueType::HasFloatElements((ValueType *)((long)&func + 2));
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x3c34,"(baseValueType.HasFloatElements())",
                             "baseValueType.HasFloatElements()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pOVar7 = LoadOptimizationOverridesValueOpnd
                           (this,pIStack_30,OptimizationOverridesFloatArraySetElementFastPathVtable)
        ;
        InsertMove(vtableVirtualOpnd,pOVar7,pIStack_30,true);
      }
    }
    else {
      pOVar7 = LoadOptimizationOverridesValueOpnd
                         (this,pIStack_30,OptimizationOverridesArraySetElementFastPathVtable);
      InsertMove(vtableVirtualOpnd,pOVar7,pIStack_30,true);
    }
  }
  if (((func._7_1_ & 1) == 0) ||
     (bVar3 = ValueType::IsLikelyNativeFloatArray((ValueType *)((long)&func + 2)), !bVar3)) {
    bVar3 = ValueType::IsLikelyMixedTypedArrayType((ValueType *)((long)&func + 2));
    if (bVar3) {
      pLVar9 = IR::LabelInstr::New(Label,this->m_func,false);
      pIVar11 = IR::IndirOpnd::New((RegOpnd *)autoReuseArrayOpnd._16_8_,0,TyUint64,func_00,false);
      InsertCompareBranch(this,&pIVar11->super_Opnd,vtableVirtualOpnd,BrEq_A,pLVar9,pIStack_30,false
                         );
      if (local_80 == VtableJavascriptNumber) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3c82,"(virtualVtableAddress)","virtualVtableAddress");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pOVar7 = LoadVTableValueOpnd(this,pIStack_30,local_80);
      if (pOVar7 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x3c84,"(vtableVirtualOpnd)","vtableVirtualOpnd");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pIVar11 = IR::IndirOpnd::New((RegOpnd *)autoReuseArrayOpnd._16_8_,0,TyUint64,func_00,false);
      pBVar10 = InsertCompareBranch(this,&pIVar11->super_Opnd,pOVar7,BrNeq_A,isNotArrayLabel,
                                    pIStack_30,false);
      InsertObjectPoison((Opnd *)autoReuseArrayOpnd._16_8_,pBVar10,pIStack_30,(bool)(func._6_1_ & 1)
                        );
      IR::Instr::InsertBefore(pIStack_30,&pLVar9->super_Instr);
    }
    else {
      pIVar11 = IR::IndirOpnd::New((RegOpnd *)autoReuseArrayOpnd._16_8_,0,TyUint64,func_00,false);
      pBStack_d0 = InsertCompareBranch(this,&pIVar11->super_Opnd,vtableVirtualOpnd,BrNeq_A,
                                       isNotArrayLabel,pIStack_30,false);
      InsertObjectPoison((Opnd *)autoReuseArrayOpnd._16_8_,pBStack_d0,pIStack_30,
                         (bool)(func._6_1_ & 1));
    }
  }
  else {
    pLVar9 = IR::LabelInstr::New(Label,this->m_func,false);
    pIVar11 = IR::IndirOpnd::New((RegOpnd *)autoReuseArrayOpnd._16_8_,0,TyUint64,func_00,false);
    pBVar10 = InsertCompareBranch(this,&pIVar11->super_Opnd,vtableVirtualOpnd,BrEq_A,pLVar9,
                                  pIStack_30,false);
    InsertObjectPoison((Opnd *)autoReuseArrayOpnd._16_8_,pBVar10,pIStack_30,(bool)(func._6_1_ & 1));
    instr = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertBefore(pIStack_30,&instr->super_Instr);
    if ((func._6_1_ & 1) == 0) {
      vtableVirtualOpnd = LoadVTableValueOpnd(this,pIStack_30,VtableJavascriptNativeIntArray);
    }
    else {
      vtableVirtualOpnd = &IR::RegOpnd::New(TyUint64,func_00)->super_Opnd;
      pSVar8 = Func::GetScriptContextInfo(func_00);
      iVar5 = (*pSVar8->_vptr_ScriptContextInfo[0x14])();
      src = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar5),TyUint64,func_00,
                                AddrOpndKindDynamicMisc);
      InsertMove(vtableVirtualOpnd,&src->super_Opnd,pIStack_30,true);
    }
    pIVar11 = IR::IndirOpnd::New((RegOpnd *)autoReuseArrayOpnd._16_8_,0,TyUint64,func_00,false);
    pBVar10 = InsertCompareBranch(this,&pIVar11->super_Opnd,vtableVirtualOpnd,BrNeq_A,
                                  isNotArrayLabel,pIStack_30,false);
    InsertObjectPoison((Opnd *)autoReuseArrayOpnd._16_8_,pBVar10,pIStack_30,(bool)(func._6_1_ & 1));
    LowererMD::LoadHelperArgument(&this->m_lowererMD,pIStack_30,(Opnd *)autoReuseArrayOpnd._16_8_);
    instr_00 = IR::Instr::New(Call,this->m_func);
    IR::Instr::InsertBefore(pIStack_30,instr_00);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr_00,HelperIntArr_ToNativeFloatArray,(LabelInstr *)0x0,
               (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
    InsertBranch(Br,isNotArrayLabel,pIStack_30);
    IR::Instr::InsertBefore(pIStack_30,&pLVar9->super_Instr);
  }
  local_d2.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType((Opnd *)autoReuseArrayOpnd._16_8_);
  bVar3 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)&local_d2.field_0);
  if ((bVar3) && (bVar3 = ValueType::IsObject((ValueType *)&local_d2.field_0), !bVar3)) {
    local_d2.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_d2.field_0,false);
  }
  local_d2.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::ToDefiniteObject((ValueType *)&local_d2.field_0);
  IR::Opnd::SetValueType((Opnd *)autoReuseArrayOpnd._16_8_,(ValueType)local_d2.field_0);
  uVar2 = autoReuseArrayOpnd._16_8_;
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_60);
  return (RegOpnd *)uVar2;
}

Assistant:

IR::RegOpnd *Lowerer::GenerateArrayTest(
    IR::RegOpnd *const baseOpnd,
    IR::LabelInstr *const isNotObjectLabel,
    IR::LabelInstr *const isNotArrayLabel,
    IR::Instr *const insertBeforeInstr,
    const bool forceFloat,
    const bool isStore,
    const bool allowDefiniteArray)
{
    Assert(baseOpnd);

    const ValueType baseValueType(baseOpnd->GetValueType());

    // Shouldn't request to do an array test when it's already known to be an array, or if it's unlikely to be an array
    Assert(!baseValueType.IsAnyOptimizedArray() || allowDefiniteArray || baseValueType.IsNativeArray());
    Assert(baseValueType.IsUninitialized() || baseValueType.HasBeenObject());

    Assert(isNotObjectLabel);
    Assert(isNotArrayLabel);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    IR::RegOpnd *arrayOpnd;
    IR::AutoReuseOpnd autoReuseArrayOpnd;
    if(baseValueType.IsLikelyObject() && baseValueType.GetObjectType() == ObjectType::ObjectWithArray)
    {
        // Only DynamicObject is allowed (DynamicObject vtable is ensured) because some object types have special handling for
        // index properties - arguments object, string object, external object, etc.
        // JavascriptArray::Jit_TryGetArrayForObjectWithArray as well.
        GenerateObjectTypeTest(baseOpnd, insertBeforeInstr, isNotObjectLabel);
        GenerateObjectHeaderInliningTest(baseOpnd, isNotArrayLabel, insertBeforeInstr);
        arrayOpnd = LoadObjectArray(baseOpnd, insertBeforeInstr);
        autoReuseArrayOpnd.Initialize(arrayOpnd, func, false /* autoDelete */);

        // test array, array
        // je   $isNotArrayLabel
        // test array, 1
        // jne  $isNotArrayLabel
        InsertTestBranch(
            arrayOpnd,
            arrayOpnd,
            Js::OpCode::BrEq_A,
            isNotArrayLabel,
            insertBeforeInstr);
        InsertTestBranch(
            arrayOpnd,
            IR::IntConstOpnd::New(1, TyUint8, func, true),
            Js::OpCode::BrNeq_A,
            isNotArrayLabel,
            insertBeforeInstr);
    }
    else
    {
        if(!baseOpnd->IsNotTaggedValue())
        {
            m_lowererMD.GenerateObjectTest(baseOpnd, insertBeforeInstr, isNotObjectLabel);
        }
        arrayOpnd = baseOpnd->Copy(func)->AsRegOpnd();
        if(!baseValueType.IsLikelyAnyOptimizedArray())
        {
            arrayOpnd->SetValueType(
                ValueType::GetObject(ObjectType::Array)
                    .ToLikely()
                    .SetHasNoMissingValues(false)
                    .SetArrayTypeId(Js::TypeIds_Array));
        }
        autoReuseArrayOpnd.Initialize(arrayOpnd, func, false /* autoDelete */);
    }

    VTableValue vtableAddress = baseValueType.IsLikelyAnyOptimizedArray()
                ? GetArrayVtableAddress(baseValueType)
                : VTableValue::VtableJavascriptArray;

    VTableValue virtualVtableAddress = VTableValue::VtableInvalid;
    if (baseValueType.IsLikelyMixedTypedArrayType())
    {
        virtualVtableAddress = GetArrayVtableAddress(baseValueType, true);
    }
    IR::Opnd * vtableOpnd;
    IR::Opnd * vtableVirtualOpnd = nullptr;
    if (isStore &&
        (vtableAddress == VTableValue::VtableJavascriptArray ||
         baseValueType.IsLikelyNativeArray()))
    {
        vtableOpnd = IR::RegOpnd::New(TyMachPtr, func);
        if (baseValueType.IsLikelyNativeArray())
        {
            if (baseValueType.HasIntElements())
            {
                InsertMove(vtableOpnd, this->LoadOptimizationOverridesValueOpnd(insertBeforeInstr, OptimizationOverridesValue::OptimizationOverridesIntArraySetElementFastPathVtable), insertBeforeInstr);
            }
            else
            {
                Assert(baseValueType.HasFloatElements());
                InsertMove(vtableOpnd, this->LoadOptimizationOverridesValueOpnd(insertBeforeInstr, OptimizationOverridesValue::OptimizationOverridesFloatArraySetElementFastPathVtable), insertBeforeInstr);
            }
        }
        else
        {
            InsertMove(vtableOpnd, this->LoadOptimizationOverridesValueOpnd(insertBeforeInstr, OptimizationOverridesValue::OptimizationOverridesArraySetElementFastPathVtable), insertBeforeInstr);
        }
    }
    else
    {
        vtableOpnd = LoadVTableValueOpnd(insertBeforeInstr, vtableAddress);
    }

    // cmp  [array], vtableAddress
    // jne  $isNotArrayLabel

    if (forceFloat && baseValueType.IsLikelyNativeFloatArray())
    {
        // We expect a native float array. If we get native int instead, convert it on the spot and bail out afterward.
        const auto goodArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        IR::BranchInstr* branchInstr = InsertCompareBranch(
            IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
            vtableOpnd,
            Js::OpCode::BrEq_A,
            goodArrayLabel,
            insertBeforeInstr);

        InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);

        IR::LabelInstr *notFloatArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        insertBeforeInstr->InsertBefore(notFloatArrayLabel);

        if (isStore)
        {
            vtableOpnd = IR::RegOpnd::New(TyMachPtr, func);
            InsertMove(vtableOpnd, IR::MemRefOpnd::New(
                           func->GetScriptContextInfo()->GetIntArraySetElementFastPathVtableAddr(),
                           TyMachPtr, func), insertBeforeInstr);
        }
        else
        {
            vtableOpnd = LoadVTableValueOpnd(insertBeforeInstr, VTableValue::VtableJavascriptNativeIntArray);
        }

        branchInstr = InsertCompareBranch(
            IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
            vtableOpnd,
            Js::OpCode::BrNeq_A,
            isNotArrayLabel,
            insertBeforeInstr);

        InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);

        m_lowererMD.LoadHelperArgument(insertBeforeInstr, arrayOpnd);

        IR::Instr *helperInstr = IR::Instr::New(Js::OpCode::Call, m_func);
        insertBeforeInstr->InsertBefore(helperInstr);
        m_lowererMD.ChangeToHelperCall(helperInstr, IR::HelperIntArr_ToNativeFloatArray);

        // Branch to the (bailout) label, because converting the array may have made our array checks unsafe.
        InsertBranch(Js::OpCode::Br, isNotArrayLabel, insertBeforeInstr);

        insertBeforeInstr->InsertBefore(goodArrayLabel);
    }
    else
    {
        IR::LabelInstr* goodArrayLabel = nullptr;
        if (baseValueType.IsLikelyMixedTypedArrayType())
        {
            goodArrayLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
            InsertCompareBranch(
                IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
                vtableOpnd,
                Js::OpCode::BrEq_A,
                goodArrayLabel,
                insertBeforeInstr);
            Assert(virtualVtableAddress);
            vtableVirtualOpnd = LoadVTableValueOpnd(insertBeforeInstr, virtualVtableAddress);
            Assert(vtableVirtualOpnd);
            IR::BranchInstr* branchInstr = InsertCompareBranch(
                IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
                vtableVirtualOpnd,
                Js::OpCode::BrNeq_A,
                isNotArrayLabel,
                insertBeforeInstr);

            InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);
            insertBeforeInstr->InsertBefore(goodArrayLabel);
        }
        else
        {
            IR::BranchInstr *branchInstr = InsertCompareBranch(
                IR::IndirOpnd::New(arrayOpnd, 0, TyMachPtr, func),
                vtableOpnd,
                Js::OpCode::BrNeq_A,
                isNotArrayLabel,
                insertBeforeInstr);

            InsertObjectPoison(arrayOpnd, branchInstr, insertBeforeInstr, isStore);
        }

    }

    ValueType arrayValueType(arrayOpnd->GetValueType());
    if(arrayValueType.IsLikelyArrayOrObjectWithArray() && !arrayValueType.IsObject())
    {
        arrayValueType = arrayValueType.SetHasNoMissingValues(false);
    }
    arrayValueType = arrayValueType.ToDefiniteObject();
    arrayOpnd->SetValueType(arrayValueType);
    return arrayOpnd;
}